

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_btype.cc
# Opt level: O0

void BuiltInType::static_init(void)

{
  Type *type;
  int bit_type;
  string *type_name;
  allocator<char> local_29;
  string local_28 [8];
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  int local_4;
  
  for (local_4 = 0; basic_pactype_name[local_4] != (char *)0x0; local_4 = local_4 + 1) {
    type_name = (string *)basic_pactype_name[local_4];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    type = (Type *)operator_new(400);
    BuiltInType((BuiltInType *)type_name,(BITType)((ulong)type >> 0x20));
    Type::AddPredefinedType(type_name,type);
    std::__cxx11::string::~string(local_28);
    std::allocator<char>::~allocator(&local_29);
  }
  return;
}

Assistant:

void BuiltInType::static_init()
	{
	for ( int bit_type = 0; basic_pactype_name[bit_type]; ++bit_type )
		{
		Type::AddPredefinedType(basic_pactype_name[bit_type], new BuiltInType((BITType)bit_type));
		}
	}